

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O3

void bltchar(LispPTR *args)

{
  DLword *ybase;
  DLword DVar1;
  ushort uVar2;
  ushort uVar3;
  bool bVar4;
  DLword *pDVar5;
  ushort uVar6;
  ulong uVar7;
  uint *puVar8;
  sbyte sVar9;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int w;
  uint uVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  uint *puVar18;
  uint uVar19;
  uint uVar20;
  ushort uVar21;
  int iVar22;
  uint uVar23;
  uint *puVar24;
  ulong uVar25;
  uint uVar26;
  uint *puVar27;
  uint uVar28;
  uint *puVar29;
  uint local_a4;
  uint local_98;
  uint local_94;
  uint local_80;
  uint local_74;
  uint local_70;
  sbyte sVar10;
  
  uVar7 = *(ulong *)args;
  uVar16 = (uint)uVar7;
  if ((uVar7 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)(uVar16 & 0xfffffff));
    uVar7 = *(ulong *)args;
  }
  pDVar5 = Lisp_world;
  uVar25 = (ulong)(uVar16 & 0xfffffff);
  uVar16 = (uint)(uVar7 >> 0x20);
  if ((uVar7 >> 0x20 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)(uVar16 & 0xfffffff));
  }
  DVar1 = pDVar5[uVar25 + 6];
  uVar21 = -DVar1;
  if (0 < (short)DVar1) {
    uVar21 = DVar1;
  }
  DVar1 = pDVar5[uVar25 + 2];
  uVar15 = -DVar1;
  if (0 < (short)DVar1) {
    uVar15 = DVar1;
  }
  uVar2 = pDVar5[uVar25 + 8];
  if (uVar2 != 0) {
    uVar7 = *(ulong *)(args + 4);
    uVar11 = (uint)uVar7 & 0xffff;
    w = ((uint)(uVar7 >> 0x20) & 0xffff) - uVar11;
    if (0 < w) {
      ybase = Lisp_world +
              ((ulong)pDVar5[uVar25 + 1] | (ulong)(uint)(*(int *)(pDVar5 + uVar25) << 0x10));
      uVar3 = pDVar5[uVar25 + 0xb];
      uVar6 = uVar3 >> 9 & 3;
      uVar13 = (ulong)(uVar11 >> 3) + (long)ybase;
      puVar8 = (uint *)(uVar13 & 0xfffffffffffffffc);
      uVar17 = ((uint)uVar7 & 7) + ((uint)uVar13 & 3) * 8;
      local_70 = (w + uVar17) - 1 & 0x1f;
      local_94 = -(uint)(uVar17 == 0) | ~(-1 << (-(char)uVar17 & 0x1fU));
      local_98 = -1 << (~(byte)local_70 & 0x1f);
      uVar16 = (*(ushort *)
                 ((ulong)(Lisp_world +
                         (((uint)*(undefined8 *)(args + 2) & 0xffff) +
                         *(int *)(Lisp_world + (ulong)(uVar16 & 0xfffffff) + 0x12))) ^ 2) + uVar11)
               - ((uint)((ulong)*(undefined8 *)(args + 2) >> 0x20) & 0xffff);
      ScreenLocked = 1;
      if ((int)uVar16 < 0) {
        uVar13 = -(ulong)(7 - uVar16 >> 3);
      }
      else {
        uVar13 = (ulong)(uVar16 >> 3);
      }
      uVar25 = (long)Lisp_world +
               uVar13 + ((ulong)pDVar5[uVar25 + 5] |
                        (ulong)(uint)(*(int *)(pDVar5 + uVar25 + 4) << 0x10)) * 2;
      local_74 = local_98 & local_94;
      iVar22 = (w + uVar17 >> 5) - 1;
      puVar24 = (uint *)(uVar25 & 0xfffffffffffffffc);
      uVar16 = (uVar16 & 7) + ((uint)uVar25 & 3) * 8;
      local_80 = w + uVar16 + 0x1f & 0x1f;
      uVar20 = uVar16 - uVar17 & 0x1f;
      uVar19 = uVar17 - uVar16 & 0x1f;
      uVar23 = 0;
      local_a4 = -(uint)(uVar20 == 0) | ~(-1 << (sbyte)uVar20);
      uVar12 = -(uVar3 >> 0xb & 1);
      uVar11 = (uint)uVar2;
      do {
        uVar26 = *puVar24;
        sVar9 = (sbyte)uVar19;
        sVar10 = (sbyte)uVar20;
        if ((uVar17 < uVar16) && (0x20 - w < (int)uVar16)) {
          puVar27 = puVar24 + 2;
          uVar28 = puVar24[1] >> sVar9 & local_a4 | uVar26 << sVar10;
          uVar23 = ~local_a4 & puVar24[1] << sVar10;
        }
        else {
          puVar27 = puVar24 + 1;
          if (uVar17 < uVar16) {
            uVar28 = uVar26 << sVar10;
          }
          else {
            uVar28 = uVar26 >> sVar9 & local_a4;
            uVar23 = ~local_a4 & uVar26 << sVar10;
          }
        }
        uVar28 = uVar28 ^ uVar12;
        puVar18 = puVar8;
        uVar26 = local_74;
        if ((int)uVar17 < 0x21 - w) {
LAB_0011002c:
          uVar14 = *puVar18;
          switch(uVar6) {
          case 1:
            uVar28 = uVar28 & uVar14;
            break;
          case 2:
            uVar28 = uVar28 | uVar14;
            break;
          case 3:
            uVar28 = uVar28 ^ uVar14;
          }
          *puVar18 = uVar14 & ~uVar26 | uVar28 & uVar26;
        }
        else {
          uVar26 = *puVar8;
          switch(uVar6) {
          case 1:
            uVar28 = uVar28 & uVar26;
            break;
          case 2:
            uVar28 = uVar28 | uVar26;
            break;
          case 3:
            uVar28 = uVar28 ^ uVar26;
          }
          *puVar8 = uVar28 & local_94 | uVar26 & ~local_94;
          puVar18 = puVar8 + 1;
          if (uVar16 == uVar17) {
            if ((uVar3 >> 0xb & 1) == 0) {
              switch(uVar6) {
              case 0:
                if (0 < iVar22) {
                  uVar26 = iVar22 + 1;
                  do {
                    uVar28 = *puVar27;
                    puVar27 = puVar27 + 1;
                    *puVar18 = uVar28;
                    puVar18 = puVar18 + 1;
                    uVar26 = uVar26 - 1;
                  } while (1 < uVar26);
                }
                break;
              case 1:
                if (0 < iVar22) {
                  uVar26 = iVar22 + 1;
                  do {
                    *puVar18 = *puVar18 & *puVar27;
                    puVar27 = puVar27 + 1;
                    puVar18 = puVar18 + 1;
                    uVar26 = uVar26 - 1;
                  } while (1 < uVar26);
                }
                break;
              case 2:
                if (0 < iVar22) {
                  uVar26 = iVar22 + 1;
                  do {
                    *puVar18 = *puVar18 | *puVar27;
                    puVar27 = puVar27 + 1;
                    puVar18 = puVar18 + 1;
                    uVar26 = uVar26 - 1;
                  } while (1 < uVar26);
                }
                break;
              case 3:
                if (0 < iVar22) {
                  uVar26 = iVar22 + 1;
                  do {
                    *puVar18 = *puVar18 ^ *puVar27;
                    puVar27 = puVar27 + 1;
                    puVar18 = puVar18 + 1;
                    uVar26 = uVar26 - 1;
                  } while (1 < uVar26);
                }
              }
            }
            else {
              switch(uVar6) {
              case 0:
                if (0 < iVar22) {
                  uVar26 = iVar22 + 1;
                  do {
                    uVar28 = *puVar27;
                    puVar27 = puVar27 + 1;
                    *puVar18 = ~uVar28;
                    puVar18 = puVar18 + 1;
                    uVar26 = uVar26 - 1;
                  } while (1 < uVar26);
                }
                break;
              case 1:
                if (0 < iVar22) {
                  uVar26 = iVar22 + 1;
                  do {
                    *puVar18 = *puVar18 & ~*puVar27;
                    puVar27 = puVar27 + 1;
                    puVar18 = puVar18 + 1;
                    uVar26 = uVar26 - 1;
                  } while (1 < uVar26);
                }
                break;
              case 2:
                if (0 < iVar22) {
                  uVar26 = iVar22 + 1;
                  do {
                    *puVar18 = *puVar18 | ~*puVar27;
                    puVar27 = puVar27 + 1;
                    puVar18 = puVar18 + 1;
                    uVar26 = uVar26 - 1;
                  } while (1 < uVar26);
                }
                break;
              case 3:
                if (0 < iVar22) {
                  uVar26 = iVar22 + 1;
                  do {
                    uVar28 = *puVar27;
                    puVar27 = puVar27 + 1;
                    *puVar18 = ~(uVar28 ^ *puVar18);
                    puVar18 = puVar18 + 1;
                    uVar26 = uVar26 - 1;
                  } while (1 < uVar26);
                }
              }
            }
          }
          else if ((uVar3 >> 0xb & 1) == 0) {
            switch(uVar6) {
            case 0:
              if (0 < iVar22) {
                uVar26 = iVar22 + 1;
                do {
                  uVar28 = *puVar27;
                  puVar27 = puVar27 + 1;
                  uVar14 = uVar28 >> sVar9 | uVar23;
                  uVar23 = uVar28 << sVar10;
                  *puVar18 = uVar14;
                  puVar18 = puVar18 + 1;
                  uVar26 = uVar26 - 1;
                } while (1 < uVar26);
              }
              break;
            case 1:
              if (0 < iVar22) {
                uVar28 = iVar22 + 1;
                uVar26 = uVar23;
                do {
                  uVar14 = *puVar27;
                  puVar27 = puVar27 + 1;
                  uVar23 = uVar14 << sVar10;
                  *puVar18 = *puVar18 & (uVar14 >> sVar9 | uVar26);
                  puVar18 = puVar18 + 1;
                  uVar28 = uVar28 - 1;
                  uVar26 = uVar23;
                } while (1 < uVar28);
              }
              break;
            case 2:
              if (0 < iVar22) {
                uVar28 = iVar22 + 1;
                puVar29 = puVar18;
                uVar26 = uVar23;
                do {
                  uVar14 = *puVar27;
                  puVar27 = puVar27 + 1;
                  uVar23 = uVar14 << sVar10;
                  puVar18 = puVar29 + 1;
                  *puVar29 = uVar26 | *puVar29 | uVar14 >> sVar9;
                  uVar28 = uVar28 - 1;
                  puVar29 = puVar18;
                  uVar26 = uVar23;
                } while (1 < uVar28);
              }
              break;
            case 3:
              if (0 < iVar22) {
                uVar28 = iVar22 + 1;
                uVar26 = uVar23;
                do {
                  uVar14 = *puVar27;
                  puVar27 = puVar27 + 1;
                  uVar23 = uVar14 << sVar10;
                  *puVar18 = *puVar18 ^ (uVar14 >> sVar9 | uVar26);
                  puVar18 = puVar18 + 1;
                  uVar28 = uVar28 - 1;
                  uVar26 = uVar23;
                } while (1 < uVar28);
              }
            }
          }
          else {
            switch(uVar6) {
            case 0:
              if (0 < iVar22) {
                uVar26 = iVar22 + 1;
                do {
                  uVar28 = *puVar27;
                  puVar27 = puVar27 + 1;
                  uVar14 = uVar28 >> sVar9 | uVar23;
                  uVar23 = uVar28 << sVar10;
                  *puVar18 = ~uVar14;
                  puVar18 = puVar18 + 1;
                  uVar26 = uVar26 - 1;
                } while (1 < uVar26);
              }
              break;
            case 1:
              if (0 < iVar22) {
                uVar26 = iVar22 + 1;
                do {
                  uVar28 = *puVar27;
                  puVar27 = puVar27 + 1;
                  uVar14 = uVar28 >> sVar9 | uVar23;
                  uVar23 = uVar28 << sVar10;
                  *puVar18 = *puVar18 & ~uVar14;
                  puVar18 = puVar18 + 1;
                  uVar26 = uVar26 - 1;
                } while (1 < uVar26);
              }
              break;
            case 2:
              if (0 < iVar22) {
                uVar26 = iVar22 + 1;
                do {
                  uVar28 = *puVar27;
                  puVar27 = puVar27 + 1;
                  uVar14 = uVar28 >> sVar9 | uVar23;
                  uVar23 = uVar28 << sVar10;
                  *puVar18 = *puVar18 | ~uVar14;
                  puVar18 = puVar18 + 1;
                  uVar26 = uVar26 - 1;
                } while (1 < uVar26);
              }
              break;
            case 3:
              if (0 < iVar22) {
                uVar26 = iVar22 + 1;
                puVar29 = puVar18;
                do {
                  uVar28 = *puVar27;
                  puVar27 = puVar27 + 1;
                  uVar14 = uVar28 >> sVar9 | uVar23;
                  uVar23 = uVar28 << sVar10;
                  puVar18 = puVar29 + 1;
                  *puVar29 = ~(uVar14 ^ *puVar29);
                  uVar26 = uVar26 - 1;
                  puVar29 = puVar18;
                } while (1 < uVar26);
              }
            }
          }
          if (local_70 != 0x1f) {
            uVar28 = uVar23;
            if (local_80 <= local_70) {
              uVar28 = *puVar27 >> sVar9 & local_a4 | uVar23;
            }
            uVar28 = uVar28 ^ uVar12;
            uVar26 = local_98;
            goto LAB_0011002c;
          }
        }
        uVar26 = (uint)uVar21;
        uVar28 = (uint)uVar15;
        if (((uVar15 | uVar21) & 0x1f) != 0) {
          uVar28 = uVar17 + uVar15;
          uVar17 = uVar28 & 0x1f;
          local_70 = (uVar17 + w) - 1 & 0x1f;
          local_94 = -(uint)(uVar17 == 0) | ~(-1 << (-(char)uVar17 & 0x1fU));
          local_98 = -1 << (~(byte)local_70 & 0x1f);
          local_74 = local_98 & local_94;
          iVar22 = (uVar17 + w >> 5) - 1;
          uVar26 = uVar16 + uVar21;
          uVar16 = uVar26 & 0x1f;
          local_80 = w + 0x1f + uVar26 & 0x1f;
          uVar19 = uVar28 - uVar26 & 0x1f;
          uVar20 = uVar26 - uVar28 & 0x1f;
          local_a4 = -(uint)(uVar20 == 0) | ~(-1 << (sbyte)uVar20);
        }
        puVar8 = puVar8 + (uVar28 >> 5);
        puVar24 = puVar24 + (uVar26 >> 5);
        bVar4 = 1 < (int)uVar11;
        uVar11 = uVar11 - 1;
      } while (bVar4);
      if ((DisplayRegion68k <= ybase) && (ybase <= DISP_MAX_Address)) {
        flush_display_lineregion(uVar7 & 0xffff,ybase,w,(uint)uVar2);
      }
      ScreenLocked = 0;
    }
  }
  return;
}

Assistant:

void bltchar(LispPTR *args)
/*      args[0] :       PILOTBBT
 *      args[1] :       DISPLAYDATA
 *      args[2] :       CHAR8CODE
 *      args[3] :       CURX
 *      args[4] :       LEFT
 *      args[5] :       RIGHT
 */
{
  PILOTBBT *pbt;
  DISPLAYDATA *dspdata;
  int base;
#ifdef REALCURSOR
  int displayflg;
#endif
  int w, h;
  int backwardflg = 0, sx, dx, srcbpl, dstbpl, src_comp, op;
  DLword *srcbase, *dstbase;
  int gray = 0;
#ifdef NEWBITBLT
  int num_gray = 0, curr_gray_line = 0;
#endif

  pbt = (PILOTBBT *)NativeAligned4FromLAddr(((BLTC *)args)->pilotbbt);
  dspdata = (DISPLAYDATA *)NativeAligned4FromLAddr(((BLTC *)args)->displaydata);

  srcbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtsourcehi, pbt->pbtsourcelo));

  dstbase = (DLword *)NativeAligned2FromLAddr(VAG2(pbt->pbtdesthi, pbt->pbtdestlo));

  srcbpl = abs(pbt->pbtsourcebpl);
  dstbpl = abs(pbt->pbtdestbpl);
  h = pbt->pbtheight;
  w = ((BLTC *)args)->right - ((BLTC *)args)->left;
  if ((h <= 0) || (w <= 0)) return;

  base = GETWORD(NativeAligned2FromLAddr(dspdata->ddoffsetscache + ((BLTC *)args)->char8code));
  sx = base + ((BLTC *)args)->left - ((BLTC *)args)->curx;
  dx = ((BLTC *)args)->left;

#ifdef REALCURSOR
  /* if displayflg != 0 then source or destination is DisplayBitMap
   * Now we consider about only destination
   */
  displayflg = cursorin(pbt->pbtdesthi, (pbt->pbtdestlo + (((BLTC *)args)->left >> 4)),
                        (((BLTC *)args)->right - ((BLTC *)args)->left), pbt->pbtheight, pbt->pbtbackward);
#endif /* REALCURSOR */

  op = pbt->pbtoperation;
  src_comp = pbt->pbtsourcetype;

  LOCKSCREEN;

#ifdef REALCURSOR
  if (displayflg) HideCursor;
#endif /* REALCURSOR */

#ifdef NEWBITBLT
  bitblt(srcbase, dstbase, sx, dx, w, h, srcbpl, dstbpl, backwardflg, src_comp, op, gray, num_gray,
         curr_gray_line);
#else
  new_char_bitblt_code;
#endif

#ifdef DISPLAYBUFFER
#ifdef COLOR
  if (MonoOrColor == MONO_SCREEN)
#endif /* COLOR */

    if (in_display_segment(dstbase)) { flush_display_lineregion(dx, dstbase, w, h); }
#endif

#ifdef XWINDOW
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* XWINDOW */

#ifdef SDL
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* SDL */

#ifdef DOS
  if (in_display_segment(dstbase)) flush_display_lineregion(dx, dstbase, w, h);
#endif /* DOS */

#ifdef REALCURSOR
  if (displayflg) ShowCursor;
#endif /* REALCURSOR */

  UNLOCKSCREEN;
}